

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O1

bool __thiscall InterpreterThunkEmitter::NewThunkBlock(InterpreterThunkEmitter *this)

{
  RealCount *pRVar1;
  bool bVar2;
  code *pcVar3;
  DWORD DVar4;
  Type pSVar5;
  bool bVar6;
  undefined4 *puVar7;
  TEmitBufferAllocation *allocation;
  ThreadContext *pTVar8;
  Type pSVar9;
  ThreadContextInfo *threadContext;
  void *local_58;
  void *pdataTable;
  PRUNTIME_FUNCTION pdataStart;
  intptr_t epilogEnd;
  Type pSStack_38;
  DWORD count;
  BYTE *buffer;
  
  bVar2 = (this->scriptContext->config).NoDynamicThunks;
  if (bVar2 != false) {
LAB_0056c1b8:
    return (bool)(bVar2 ^ 1);
  }
  if (this->thunkCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x168,"(this->thunkCount == 0)","this->thunkCount == 0");
    if (!bVar6) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  allocation = EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
               ::AllocateBuffer(&this->emitBufferManager,0x1000,(BYTE **)&stack0xffffffffffffffc8,0,
                                0,false,false);
  if (allocation != (TEmitBufferAllocation *)0x0) {
    bVar6 = EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
            ::ProtectBufferWithExecuteReadWriteForInterpreter(&this->emitBufferManager,allocation);
    if (bVar6) {
      pdataTable = (void *)0x0;
      pdataStart = (PRUNTIME_FUNCTION)0x0;
      epilogEnd._4_4_ = this->thunkCount;
      pTVar8 = this->scriptContext->threadContext;
      threadContext = &pTVar8->super_ThreadContextInfo;
      if (pTVar8 == (ThreadContext *)0x0) {
        threadContext = (ThreadContextInfo *)0x0;
      }
      FillBuffer(threadContext,this->isAsmInterpreterThunk,(intptr_t)pSStack_38,(size_t)&pdataStart,
                 (BYTE *)pSStack_38,(PRUNTIME_FUNCTION *)&pdataTable,(intptr_t *)&pdataStart,
                 (DWORD *)((long)&epilogEnd + 4));
      bVar6 = EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
              ::CommitBufferForInterpreter
                        (&this->emitBufferManager,allocation,(BYTE *)pSStack_38,0x1000);
      pSVar5 = pSStack_38;
      if (bVar6) {
        pTVar8 = ThreadContext::GetContextForCurrentThread();
        ThreadContextInfo::SetValidCallTargetForCFG(&pTVar8->super_ThreadContextInfo,pSVar5,true);
        pSVar5 = pSStack_38;
        DVar4 = epilogEnd._4_4_;
        pSVar9 = (Type)new<Memory::ArenaAllocator>(0x28,this->allocator,0x366bee);
        pSVar9[1].next = (Type)0x0;
        pSVar9[2].next = pSVar5;
        pSVar9[3].next = (Type)0x0;
        *(DWORD *)&pSVar9[4].next = DVar4;
        pSVar9->next = (this->thunkBlocks).super_SListNodeBase<Memory::ArenaAllocator>.next;
        (this->thunkBlocks).super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar9;
        pRVar1 = &(this->thunkBlocks).super_RealCount;
        pRVar1->count = pRVar1->count + 1;
        PDataManager::RegisterPdata
                  ((RUNTIME_FUNCTION *)pdataTable,(ULONG_PTR)pSStack_38,(ULONG_PTR)pdataStart,
                   &local_58,1,1);
        ThunkBlock::SetPdata((ThunkBlock *)(pSVar9 + 1),local_58);
        this->thunkBuffer = (BYTE *)pSStack_38;
        this->thunkCount = DVar4;
        goto LAB_0056c1b8;
      }
    }
  }
  Js::Throw::OutOfMemory();
}

Assistant:

bool InterpreterThunkEmitter::NewThunkBlock()
{
    if (this->scriptContext->GetConfig()->IsNoDynamicThunks())
    {
        return false;
    }

#ifdef ENABLE_OOP_NATIVE_CODEGEN
    if (CONFIG_FLAG(ForceStaticInterpreterThunk))
    {
        return false;
    }

    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        return NewOOPJITThunkBlock();
    }
#endif

    Assert(this->thunkCount == 0);
    BYTE* buffer;

    EmitBufferAllocation<VirtualAllocWrapper, PreReservedVirtualAllocWrapper> * allocation = emitBufferManager.AllocateBuffer(BlockSize, &buffer);
    if (allocation == nullptr)
    {
        Js::Throw::OutOfMemory();
    }
    if (!emitBufferManager.ProtectBufferWithExecuteReadWriteForInterpreter(allocation))
    {
        Js::Throw::OutOfMemory();
    }

#if PDATA_ENABLED
    PRUNTIME_FUNCTION pdataStart = nullptr;
    intptr_t epilogEnd = 0;
#endif

    DWORD count = this->thunkCount;
    FillBuffer(
        this->scriptContext->GetThreadContext(),
        this->isAsmInterpreterThunk,
        (intptr_t)buffer,
        BlockSize,
        buffer,
#if PDATA_ENABLED
        &pdataStart,
        &epilogEnd,
#endif
        &count
    );

    if (!emitBufferManager.CommitBufferForInterpreter(allocation, buffer, BlockSize))
    {
        Js::Throw::OutOfMemory();
    }

    // Call to set VALID flag for CFG check
    BYTE* callTarget = buffer;
#ifdef _M_ARM
    // We want to allow the actual callable value, so thumb-tag the address
    callTarget = (BYTE*)((uintptr_t)buffer | 0x1);
#endif
    ThreadContext::GetContextForCurrentThread()->SetValidCallTargetForCFG(callTarget);

    // Update object state only at the end when everything has succeeded - and no exceptions can be thrown.
    auto block = this->thunkBlocks.PrependNode(allocator, buffer, count);
#if PDATA_ENABLED
    void* pdataTable;
    PDataManager::RegisterPdata((PRUNTIME_FUNCTION)pdataStart, (ULONG_PTR)buffer, (ULONG_PTR)epilogEnd, &pdataTable);
    block->SetPdata(pdataTable);
#else
    Unused(block);
#endif
    this->thunkBuffer = buffer;
    this->thunkCount = count;
    return true;
}